

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O2

int invertMatrixTest(void)

{
  ostream *poVar1;
  Index in_RCX;
  Index cols;
  type local_1b0;
  Quaternion q;
  Matrix4 hi;
  Matrix3 R1;
  Matrix4 h;
  
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,4,1,0,4,1>>
            ((type *)&h,(ProbabilityLawSimulation *)0x4,1,in_RCX,-1.0,1.0);
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)&q,(Matrix<double,_4,_1,_0,_4,_1> *)&h);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&q);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&q);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&h,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&hi);
  cols = 0;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&hi,
             (Matrix<double,_4,_4,_0,_4,_4> *)&h,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&hi,&R1);
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1b0,(ProbabilityLawSimulation *)0x3,1,cols,-1.0,1.0);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&hi,
             (Matrix<double,_4,_4,_0,_4,_4> *)&h,0,3,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&hi,&local_1b0);
  stateObservation::kine::invertHomoMatrix(&hi,&h);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&h);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&hi);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&h;
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                             &local_1b0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&hi;
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&h;
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                              *)&local_1b0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int invertMatrixTest() // tested OK
{
  stateObservation::Quaternion q(tools::ProbabilityLawSimulation::getUniformMatrix<Vector4>());

  q.normalize();

  Matrix3 R1(q.matrix());

  Matrix4 h(Matrix4::Identity());

  h.block(0, 0, 3, 3) = R1;
  h.block(0, 3, 3, 1) = tools::ProbabilityLawSimulation::getUniformMatrix<Vector3>();

  Matrix4 hi = kine::invertHomoMatrix(h);

  std::cout << h << std::endl << std::endl;
  std::cout << hi << std::endl << std::endl;
  std::cout << h.inverse() << std::endl << std::endl;
  std::cout << hi * h << std::endl << std::endl;
  return 0;
}